

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sndseq.cpp
# Opt level: O1

int FindMode(int seqnum,int mode)

{
  FSoundSequence *pFVar1;
  bool bVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  
  if (0 < seqnum) {
    pFVar1 = Sequences.super_TArray<FSoundSequence_*,_FSoundSequence_*>.Array[(uint)seqnum];
    if (((char)pFVar1->Script[0] == '\x10') && (uVar4 = pFVar1->Script[0] >> 8, 0 < (int)uVar4)) {
      uVar5 = 0;
      do {
        if (pFVar1[1].Script[uVar5 * 2 + -3] == mode) {
          if ((long)(int)Sequences.super_TArray<FSoundSequence_*,_FSoundSequence_*>.Count < 1) {
            return -1;
          }
          lVar3 = (long)(int)Sequences.super_TArray<FSoundSequence_*,_FSoundSequence_*>.Count;
          while ((Sequences.super_TArray<FSoundSequence_*,_FSoundSequence_*>.Array[lVar3 + -1] ==
                  (FSoundSequence *)0x0 ||
                 (pFVar1[1].Script[uVar5 * 2 + -2] !=
                  (Sequences.super_TArray<FSoundSequence_*,_FSoundSequence_*>.Array[lVar3 + -1]->
                  SeqName).Index))) {
            bVar2 = lVar3 < 2;
            lVar3 = lVar3 + -1;
            if (bVar2) {
              return -1;
            }
          }
          return (int)lVar3 + -1;
        }
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
    }
  }
  return seqnum;
}

Assistant:

static int FindMode(int seqnum, int mode)
{
	if (seqnum <= 0)
	{ // Sequence does not exist.
		return seqnum;
	}
	FSoundSequence *seq = Sequences[seqnum];
	if (GetCommand(seq->Script[0]) != SS_CMD_SELECT)
	{ // This sequence doesn't select any others.
		return seqnum;
	}
	// Search for the desired mode amongst the selections
	int nummodes = GetData(seq->Script[0]);
	for (int i = 0; i < nummodes; ++i)
	{
		if (seq->Script[1 + i*2] == mode)
		{
			return FindSequence(ENamedName(seq->Script[1 + i*2 + 1]));
		}
	}
	// The mode isn't selected, which means it stays on this sequence.
	return seqnum;
}